

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hex.c
# Opt level: O3

void test_hex_encode(void)

{
  int iVar1;
  char blob [17];
  char buffer [256];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138;
  char local_128 [264];
  
  local_148 = 0x706050403020100;
  uStack_140 = 0xf0e0d0c0b0a0908;
  local_138 = 0xff;
  iVar1 = hex_encode(&local_148,0x11,local_128,0x100,1);
  acutest_check_((uint)(iVar1 == 0x22),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-hex.c"
                 ,0x28,"%s",
                 "hex_encode(blob, sizeof(blob), buffer, sizeof(buffer), 1) == strlen(expect_lower)"
                );
  iVar1 = bcmp(local_128,"000102030405060708090a0b0c0d0e0fff",0x23);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-hex.c"
                 ,0x29,"%s");
  iVar1 = hex_encode(&local_148,0x11,local_128,0x100,0);
  acutest_check_((uint)(iVar1 == 0x22),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-hex.c"
                 ,0x2b,"%s",
                 "hex_encode(blob, sizeof(blob), buffer, sizeof(buffer), 0) == strlen(expect_upper)"
                );
  iVar1 = bcmp(local_128,"000102030405060708090A0B0C0D0E0FFF",0x23);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-hex.c"
                 ,0x2c,"%s","strcmp(buffer, expect_upper) == 0");
  return;
}

Assistant:

static void
test_hex_encode(void)
{
    char blob[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 0xff };
    char buffer[256];
    char expect_lower[] = "000102030405060708090a0b0c0d0e0fff";
    char expect_upper[] = "000102030405060708090A0B0C0D0E0FFF";

    TEST_CHECK(hex_encode(blob, sizeof(blob), buffer, sizeof(buffer), 1) == strlen(expect_lower));
    TEST_CHECK(strcmp(buffer, expect_lower) == 0);

    TEST_CHECK(hex_encode(blob, sizeof(blob), buffer, sizeof(buffer), 0) == strlen(expect_upper));
    TEST_CHECK(strcmp(buffer, expect_upper) == 0);
}